

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_mesh.cpp
# Opt level: O0

bool Internal_DuplicateVertices
               (ON_Mesh *mesh,ON_3dPointArray *D,ON_SimpleArray<VertexToDuplicate> *dups_array)

{
  bool bVar1;
  uint mesh_F_count_00;
  uint uVar2;
  uint vertex_dups_count_00;
  uint uVar3;
  long *plVar4;
  ON_3dPoint *pOVar5;
  VertexToDuplicate *vertex_dups_00;
  ON_SubDVertex *pOVar6;
  ON_SubDFace *pOVar7;
  ON_SubDEdge *this;
  VertexToDuplicate *pVVar8;
  uint local_114;
  uint k_1;
  uint k0;
  uint k1;
  VertexToDuplicate *vertex_dup_1;
  VertexToDuplicate *vertex_dup;
  uint efi;
  ON_SubDEdge *edge;
  uint local_e0;
  uint k;
  uint sector_count;
  uint vertex_dups_count;
  VertexToDuplicate *vertex_dups;
  ON_3dPoint P;
  uint mesh_V_index0;
  int rc;
  uint i0;
  uint i1;
  VertexToDuplicate key;
  VertexToDuplicate *dups;
  ON_SubDSectorIterator sit;
  uint sector_id;
  uint dups_count;
  uint mesh_D_count0;
  uint mesh_F_count;
  ON_SimpleArray<VertexToDuplicate> *dups_array_local;
  ON_3dPointArray *D_local;
  ON_Mesh *mesh_local;
  
  mesh_F_count_00 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
  uVar2 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(&D->super_ON_SimpleArray<ON_3dPoint>);
  sit._68_4_ = ON_SimpleArray<VertexToDuplicate>::UnsignedCount(dups_array);
  if ((uint)sit._68_4_ < 2) {
    return true;
  }
  sit.m_current_ring_index = 0;
  ON_SimpleArray<VertexToDuplicate>::QuickSortAndRemoveDuplicates
            (dups_array,VertexToDuplicate::CompareVertexIdAndFaceId);
  ON_SubDSectorIterator::ON_SubDSectorIterator((ON_SubDSectorIterator *)&dups);
  key._24_8_ = ON_SimpleArray::operator_cast_to_VertexToDuplicate_((ON_SimpleArray *)dups_array);
  VertexToDuplicate::VertexToDuplicate((VertexToDuplicate *)&i0);
  mesh_V_index0 = 0;
LAB_0091636d:
  if ((uint)sit._68_4_ <= mesh_V_index0) {
    return true;
  }
  plVar4 = (long *)(key._24_8_ + (ulong)mesh_V_index0 * 0x20);
  _i0 = (ON_SubDVertex *)*plVar4;
  key.m_vertex = (ON_SubDVertex *)plVar4[1];
  key.m_face = (ON_SubDFace *)plVar4[2];
  key.m_sector_id = *(uint *)(plVar4 + 3);
  rc = mesh_V_index0;
  if (_i0 == (ON_SubDVertex *)0x0) {
    ON_SubDIncrementErrorCount();
    return false;
  }
  while ((rc = rc + 1, (uint)rc < (uint)sit._68_4_ &&
         (P.z._4_4_ = VertexToDuplicate::CompareVertexId
                                ((VertexToDuplicate *)&i0,
                                 (VertexToDuplicate *)(key._24_8_ + (ulong)(uint)rc * 0x20)),
         -1 < P.z._4_4_))) {
    if ((P.z._4_4_ != 0) ||
       (((_i0 != *(ON_SubDVertex **)(key._24_8_ + (ulong)(uint)rc * 0x20) ||
         (key.m_face._4_4_ != *(uint *)(key._24_8_ + (ulong)(uint)rc * 0x20 + 0x14))) ||
        (uVar2 <= key.m_face._4_4_)))) {
      ON_SubDIncrementErrorCount();
      return false;
    }
  }
  if (rc != mesh_V_index0 + 1) {
    P.z._0_4_ = key.m_face._4_4_;
    pOVar5 = ON_SimpleArray<ON_3dPoint>::operator[]
                       (&D->super_ON_SimpleArray<ON_3dPoint>,key.m_face._4_4_);
    vertex_dups = (VertexToDuplicate *)pOVar5->x;
    P.x = pOVar5->y;
    P.y = pOVar5->z;
    vertex_dups_00 = (VertexToDuplicate *)(key._24_8_ + (ulong)mesh_V_index0 * 0x20);
    vertex_dups_count_00 = rc - mesh_V_index0;
    local_e0 = 0;
    for (edge._4_4_ = 0; edge._4_4_ < vertex_dups_count_00; edge._4_4_ = edge._4_4_ + 1) {
      if (vertex_dups_00[edge._4_4_].m_sector_id == 0) {
        sit.m_current_ring_index = sit.m_current_ring_index + 1;
        local_e0 = local_e0 + 1;
        pOVar6 = ON_SubDSectorIterator::Initialize
                           ((ON_SubDSectorIterator *)&dups,vertex_dups_00[edge._4_4_].m_face,0,_i0);
        if (pOVar6 == (ON_SubDVertex *)0x0) {
          ON_SubDIncrementErrorCount();
          local_e0 = 0;
          break;
        }
        pOVar7 = ON_SubDSectorIterator::IncrementToCrease((ON_SubDSectorIterator *)&dups,-1);
        if (pOVar7 == (ON_SubDFace *)0x0) {
          ON_SubDIncrementErrorCount();
          local_e0 = 0;
          break;
        }
        if ((edge._4_4_ == 0) && (bVar1 = ON_SubDVertex::IsDart(_i0), bVar1)) {
          this = ON_SubDSectorIterator::CurrentEdge((ON_SubDSectorIterator *)&dups,0);
          if ((this != (ON_SubDEdge *)0x0) &&
             ((bVar1 = ON_SubDEdge::IsCrease(this), bVar1 && (this->m_face_count == 2)))) {
            vertex_dup._4_4_ = 0;
            goto LAB_00916666;
          }
          ON_SubDIncrementErrorCount();
          local_e0 = 0;
          break;
        }
        key.m_vertex = (ON_SubDVertex *)
                       ON_SubDSectorIterator::CurrentFace((ON_SubDSectorIterator *)&dups);
        while (key.m_vertex != (ON_SubDVertex *)0x0) {
          pVVar8 = Internal_FindMatchingVertexIdAndFaceId
                             ((VertexToDuplicate *)&i0,vertex_dups_00,vertex_dups_count_00);
          if (pVVar8 == (VertexToDuplicate *)0x0) {
            ON_SubDIncrementErrorCount();
            local_e0 = 0;
            break;
          }
          pVVar8->m_sector_id = sit.m_current_ring_index;
          key.m_vertex = (ON_SubDVertex *)
                         ON_SubDSectorIterator::NextFace((ON_SubDSectorIterator *)&dups,AnyCrease);
        }
        if (local_e0 == 0) break;
      }
    }
    goto LAB_0091682b;
  }
  goto LAB_009169b1;
LAB_00916666:
  if (1 < vertex_dup._4_4_) goto LAB_00916746;
  key.m_vertex = (ON_SubDVertex *)ON_SubDEdge::Face(this,vertex_dup._4_4_);
  pVVar8 = Internal_FindMatchingVertexIdAndFaceId
                     ((VertexToDuplicate *)&i0,vertex_dups_00,vertex_dups_count_00);
  if (pVVar8 == (VertexToDuplicate *)0x0) {
    ON_SubDIncrementErrorCount();
    local_e0 = 0;
    goto LAB_00916746;
  }
  uVar3 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(&D->super_ON_SimpleArray<ON_3dPoint>);
  pVVar8->m_mesh_V_index = uVar3;
  ON_SimpleArray<ON_3dPoint>::Append
            (&D->super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)&vertex_dups);
  bVar1 = Internal_UpdateMeshFaceVertexIndex
                    (mesh,pVVar8->m_mesh_F_index,mesh_F_count_00,P.z._0_4_,pVVar8->m_mesh_V_index);
  if (!bVar1) {
    ON_SubDIncrementErrorCount();
    local_e0 = 0;
    goto LAB_00916746;
  }
  vertex_dup._4_4_ = vertex_dup._4_4_ + 1;
  goto LAB_00916666;
LAB_00916746:
  for (edge._4_4_ = 0; edge._4_4_ < vertex_dups_count_00; edge._4_4_ = edge._4_4_ + 1) {
    vertex_dups_00[edge._4_4_].m_sector_id = sit.m_current_ring_index;
  }
LAB_0091682b:
  if (local_e0 != 0) {
    if (1 < local_e0) {
      ON_qsort(vertex_dups_00,(ulong)vertex_dups_count_00,0x20,
               VertexToDuplicate::CompareSectorIdAndFaceId);
    }
    k_1 = 0;
    while (local_114 = k_1, k_1 < vertex_dups_count_00) {
      pVVar8 = vertex_dups_00 + k_1;
      _i0 = pVVar8->m_vertex;
      key.m_vertex = (ON_SubDVertex *)pVVar8->m_face;
      key.m_face = *(ON_SubDFace **)&pVVar8->m_sector_id;
      key.m_sector_id = pVVar8->m_mesh_F_index;
      do {
        k_1 = k_1 + 1;
        if (vertex_dups_count_00 <= k_1) break;
      } while ((uint)key.m_face == vertex_dups_00[k_1].m_sector_id);
      if (local_114 != 0) {
        uVar3 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(&D->super_ON_SimpleArray<ON_3dPoint>);
        key.m_face = (ON_SubDFace *)CONCAT44(uVar3,(uint)key.m_face);
        ON_SimpleArray<ON_3dPoint>::Append
                  (&D->super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)&vertex_dups);
        for (; local_114 < k_1; local_114 = local_114 + 1) {
          Internal_UpdateMeshFaceVertexIndex
                    (mesh,vertex_dups_00[local_114].m_mesh_F_index,mesh_F_count_00,P.z._0_4_,
                     key.m_face._4_4_);
        }
      }
    }
  }
LAB_009169b1:
  mesh_V_index0 = rc;
  goto LAB_0091636d;
}

Assistant:

static bool Internal_DuplicateVertices(
  ON_Mesh& mesh,
  ON_3dPointArray& D,
  ON_SimpleArray<VertexToDuplicate>& dups_array
  )
{
  const unsigned int mesh_F_count = mesh.m_F.UnsignedCount();
  const unsigned int mesh_D_count0 = D.UnsignedCount();

  const unsigned int dups_count = dups_array.UnsignedCount();
  if (dups_count <= 1)
    return true;

  unsigned int sector_id = 0;

  dups_array.QuickSortAndRemoveDuplicates(VertexToDuplicate::CompareVertexIdAndFaceId);

  ON_SubDSectorIterator sit;
  VertexToDuplicate* dups = dups_array;
  VertexToDuplicate key;
  unsigned int i1 = 0;
  for (unsigned int i0 = i1; i0 < dups_count; i0 = i1)
  {
    key = dups[i0];
    if (nullptr == key.m_vertex)
    {
      ON_SubDIncrementErrorCount();
      return false;
    }
    for (i1 = i0 + 1; i1 < dups_count; i1++)
    {
      int rc = VertexToDuplicate::CompareVertexId(&key,dups+i1);
      if (rc < 0)
        break;
      if ( 0 != rc
          || key.m_vertex != dups[i1].m_vertex 
          || key.m_mesh_V_index != dups[i1].m_mesh_V_index
          || key.m_mesh_V_index >= mesh_D_count0
          )
      {
        ON_SubDIncrementErrorCount();
        return false;
      }
    }

    if ( i1 == i0+1)
      continue;

    const unsigned int mesh_V_index0 = key.m_mesh_V_index;
    const ON_3dPoint P = D[mesh_V_index0];
    VertexToDuplicate* vertex_dups = dups+i0;
    const unsigned vertex_dups_count = i1 - i0;
    unsigned int sector_count = 0;
    // Set the sector id
    for (unsigned int k = 0; k < vertex_dups_count; ++k)
    {
      if (vertex_dups[k].m_sector_id > 0 )
        continue; // this was in a previously found sector.

      ++sector_id;
      ++sector_count;

      // When the priority is encoding creases, we need to divide the faces around this vertex
      // into sets that are in the same sector. Since a dart vertex has only 1 sector
      // but the crease edge at a dart needs to have duplicate vertices at both ends,
      // darts get special case handling.

      if (nullptr == sit.Initialize(vertex_dups[k].m_face, 0, key.m_vertex))
      {
        // not fatal, but don't bother with the vertices in vertex_dups[].
        ON_SubDIncrementErrorCount();
        sector_count = 0;
        break;
      }
      if (nullptr == sit.IncrementToCrease(-1))
      {
        // not fatal, but don't bother with the vertices in vertex_dups[].
        ON_SubDIncrementErrorCount();
        sector_count = 0;
        break;
      }

      if (0 == k && key.m_vertex->IsDart())
      {
        // darts have a single sector, but the dart vertex needs to be duplicated across the creased edge.
        const ON_SubDEdge* edge = sit.CurrentEdge(0);
        if (nullptr == edge || false == edge->IsCrease() || 2 != edge->m_face_count)
        {
          // not fatal, but don't bother with the vertices in vertex_dups[].
          ON_SubDIncrementErrorCount();
          sector_count = 0;
          break;
        }

        // we found the creased edge - duplicate the ON_Mesh vertices at this edge.
        for (unsigned int efi = 0; efi < 2; efi++)
        {
          key.m_face = edge->Face(efi);
          VertexToDuplicate* vertex_dup = Internal_FindMatchingVertexIdAndFaceId(&key, vertex_dups, vertex_dups_count);
          if (nullptr == vertex_dup)
          {
            // not fatal, but don't bother with the vertices in vertex_dups[].
            ON_SubDIncrementErrorCount();
            sector_count = 0;
            break;
          }
          // add a new vertex on either side of the dart's edge
          vertex_dup->m_mesh_V_index = D.UnsignedCount();
          D.Append(P);
          if ( false == Internal_UpdateMeshFaceVertexIndex(mesh, vertex_dup->m_mesh_F_index, mesh_F_count, mesh_V_index0, vertex_dup->m_mesh_V_index) )
          {
            // not fatal, but don't bother with the vertices in vertex_dups[].
            ON_SubDIncrementErrorCount();
            sector_count = 0;
            break;
          }
        }
        for (k = 0; k < vertex_dups_count; ++k)
        {
          vertex_dups[k].m_sector_id = sector_id;
        }
        break;
      }

      // assign the sector id
      for (key.m_face = sit.CurrentFace(); nullptr != key.m_face; key.m_face = sit.NextFace(ON_SubDSectorIterator::StopAt::AnyCrease))
      {
        VertexToDuplicate* vertex_dup = Internal_FindMatchingVertexIdAndFaceId(&key, vertex_dups, vertex_dups_count);
        if (nullptr == vertex_dup)
        {
          // not fatal, but don't bother with the vertices in vertex_dups[].
          ON_SubDIncrementErrorCount();
          sector_count = 0;
          break;
        }
        vertex_dup->m_sector_id = sector_id;
      }
      if (0 == sector_count)
        break;
    }

    if (0 == sector_count)
      continue;

    if (sector_count > 1)
    {
      // sort vertex_dups[] by sector id 
      ON_qsort(vertex_dups, vertex_dups_count, sizeof(vertex_dups[0]), (int(*)(const void*, const void*))VertexToDuplicate::CompareSectorIdAndFaceId);
    }
    
    unsigned int k1 = 0;
    for (unsigned int k0 = 0; k0 < vertex_dups_count; k0 = k1)
    {
      key = vertex_dups[k0];
      for (k1 = k0 + 1; k1 < vertex_dups_count; ++k1)
      {
        if (key.m_sector_id != vertex_dups[k1].m_sector_id)
          break;
      }
      if (k0 > 0)
      {
        // make a new vertex for this sector;
        key.m_mesh_V_index = D.UnsignedCount();
        D.Append(P);

        // update ON_Mesh faces in this sector to use new vertex
        for (unsigned k = k0; k < k1; ++k)
          Internal_UpdateMeshFaceVertexIndex(mesh, vertex_dups[k].m_mesh_F_index, mesh_F_count, mesh_V_index0, key.m_mesh_V_index);
      }
    }
  }

  return true;
}